

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fakeit.hpp
# Opt level: O1

void __thiscall
fakeit::
MethodMockingContext<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::MethodMockingContext
          (MethodMockingContext<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,void **vtt,Context *stubbingContext)

{
  _func_int **pp_Var1;
  Implementation *this_00;
  
  (this->super_Sequence)._vptr_Sequence = (_func_int **)&PTR__Sequence_0012f438;
  (this->super_ActualInvocationsSource)._vptr_ActualInvocationsSource =
       (_func_int **)&PTR___cxa_pure_virtual_0012cea0;
  (this->super_Matcher)._vptr_Matcher = (_func_int **)&PTR__Matcher_0012f470;
  pp_Var1 = (_func_int **)*vtt;
  (this->super_Sequence)._vptr_Sequence = pp_Var1;
  (this->super_ActualInvocationsSource)._vptr_ActualInvocationsSource =
       (_func_int **)(MethodMockingContext<std::__cxx11::string>::vtable + 0x88);
  *(void **)(pp_Var1[-3] + (long)&(this->super_Sequence)._vptr_Sequence) = vtt[1];
  *(void **)((this->super_Sequence)._vptr_Sequence[-4] +
            (long)&(this->super_Sequence)._vptr_Sequence) = vtt[2];
  (this->super_Matcher)._vptr_Matcher =
       (_func_int **)(MethodMockingContext<std::__cxx11::string>::vtable + 0xb0);
  this_00 = (Implementation *)operator_new(0x20);
  Implementation::Implementation(this_00,stubbingContext);
  (this->_impl).
  super___shared_ptr<fakeit::MethodMockingContext<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Implementation,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = this_00;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<fakeit::MethodMockingContext<std::__cxx11::string>::Implementation*>
            (&(this->_impl).
              super___shared_ptr<fakeit::MethodMockingContext<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Implementation,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,this_00);
  return;
}

Assistant:

MethodMockingContext(Context *stubbingContext)
                : _impl{new Implementation(stubbingContext)} {
        }